

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_bf16.h
# Opt level: O0

void ncnn::cast_fp32_to_bf16_sse(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  __m256 v0;
  __m256 v1;
  __m256 v0_00;
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  int iVar3;
  long *in_RSI;
  undefined8 *puVar4;
  long *in_RDI;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int i;
  unsigned_short *outptr;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  Mat *m_1;
  anon_union_4_2_947300b0 tmp;
  Mat *in_stack_fffffffffffffcc0;
  Mat *in_stack_fffffffffffffcc8;
  undefined8 in_stack_fffffffffffffcf8;
  undefined1 *puVar8;
  long *plVar9;
  undefined8 *puVar10;
  undefined8 in_stack_fffffffffffffd20;
  undefined8 *puVar11;
  long *plVar12;
  undefined4 in_stack_fffffffffffffd38;
  undefined8 uVar13;
  int *piVar14;
  undefined1 in_stack_fffffffffffffd40 [24];
  undefined1 (*local_278) [32];
  undefined8 local_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined4 local_258;
  long local_250;
  undefined4 local_248;
  undefined4 local_244;
  undefined4 local_240;
  undefined4 local_23c;
  undefined4 local_238;
  undefined8 local_230;
  undefined8 *local_228;
  int local_21c;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  int local_208;
  int local_204;
  long *local_1f8;
  long *local_1f0;
  undefined1 local_1e5;
  int local_1e4;
  undefined8 *local_1d8;
  undefined8 *local_1c8;
  undefined1 *local_1c0;
  undefined1 local_1b5;
  int local_1b4;
  undefined1 *local_1a8;
  int local_188;
  undefined4 local_184;
  undefined1 *local_180;
  undefined8 *local_170;
  undefined1 (*local_148) [32];
  undefined8 *local_138;
  undefined1 *local_130;
  undefined8 *local_128;
  undefined8 *local_120;
  undefined8 *local_118;
  long *local_110;
  undefined4 local_104;
  long local_100;
  long local_f8;
  undefined4 local_ec;
  int local_e8;
  int local_e4;
  undefined1 *local_e0;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined8 *local_c0;
  undefined4 local_b4;
  int local_b0;
  int local_ac;
  undefined8 *local_a8;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  long local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined1 (*local_58) [32];
  undefined8 local_50;
  undefined8 uStack_48;
  undefined1 (*local_40) [32];
  undefined4 local_38;
  undefined4 local_34;
  
  local_1f8 = in_RSI;
  local_1f0 = in_RDI;
  iVar3 = cpu_support_x86_avx512_bf16();
  if (iVar3 == 0) {
    local_204 = *(int *)((long)local_1f0 + 0x2c);
    local_208 = (int)local_1f0[6];
    local_20c = *(int *)((long)local_1f0 + 0x34);
    local_210 = (int)local_1f0[7];
    local_214 = (int)local_1f0[3];
    local_218 = local_204 * local_208 * local_20c * local_214;
    for (local_21c = 0; local_21c < local_210; local_21c = local_21c + 1) {
      local_1d8 = &local_270;
      local_ac = *(int *)((long)local_1f0 + 0x2c);
      local_b0 = (int)local_1f0[6];
      local_b4 = *(undefined4 *)((long)local_1f0 + 0x34);
      puVar4 = (undefined8 *)(*local_1f0 + local_1f0[8] * (long)local_21c * local_1f0[2]);
      local_c8 = local_1f0[2];
      local_cc = (undefined4)local_1f0[3];
      local_d8 = local_1f0[4];
      puVar11 = &local_270;
      local_98 = (long)local_ac * (long)local_b0 * local_c8;
      local_138 = &local_270;
      puVar10 = &local_270;
      local_9c = 0x10;
      local_1e4 = local_21c;
      local_1e5 = 1;
      local_270 = 0;
      local_260 = 0;
      local_258 = 0;
      local_248 = 0;
      local_244 = 0;
      local_240 = 0;
      local_23c = 0;
      local_238 = 0;
      local_230 = 0;
      local_268 = 0;
      local_1a8 = &stack0xfffffffffffffd40;
      local_e4 = *(int *)((long)local_1f8 + 0x2c);
      local_e8 = (int)local_1f8[6];
      local_ec = *(undefined4 *)((long)local_1f8 + 0x34);
      local_f8 = *local_1f8 + local_1f8[8] * (long)local_21c * local_1f8[2];
      local_100 = local_1f8[2];
      local_104 = (undefined4)local_1f8[3];
      local_110 = (long *)local_1f8[4];
      puVar8 = &stack0xfffffffffffffd40;
      uVar13 = 0;
      local_88 = (long)local_e4 * (long)local_e8 * in_stack_fffffffffffffd40._16_8_;
      local_8c = 0x10;
      local_1b4 = local_21c;
      local_1b5 = 1;
      local_130 = &stack0xfffffffffffffd40;
      local_278 = in_stack_fffffffffffffd40._0_8_;
      local_1c0 = &stack0xfffffffffffffd40;
      piVar14 = in_stack_fffffffffffffd40._8_8_;
      plVar9 = local_1f8;
      plVar12 = local_1f0;
      local_228 = puVar4;
      local_1c8 = puVar10;
      local_180 = local_1c0;
      local_170 = puVar10;
      local_e0 = puVar8;
      local_c0 = puVar4;
      local_a8 = puVar11;
      local_250 = local_d8;
      if (piVar14 != (int *)0x0) {
        local_184 = 0xffffffff;
        LOCK();
        local_188 = *piVar14;
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (local_188 == 1) {
          if (local_110 == (long *)0x0) {
            local_148 = local_278;
            if (local_278 != (undefined1 (*) [32])0x0) {
              free(local_278);
            }
          }
          else {
            (**(code **)(*local_110 + 0x18))(local_110,local_278);
          }
        }
      }
      uVar13 = 0;
      for (iVar3 = 0; iVar3 + 0xf < local_218; iVar3 = iVar3 + 0x10) {
        local_118 = local_228;
        uVar13 = *local_228;
        uVar5 = local_228[1];
        uVar6 = local_228[2];
        uVar7 = local_228[3];
        local_120 = local_228 + 4;
        v0_00[1] = (float)iVar3;
        v0_00[0] = (float)in_stack_fffffffffffffd38;
        v0_00[2] = (float)in_stack_fffffffffffffd40._0_4_;
        v0_00[3] = (float)in_stack_fffffffffffffd40._4_4_;
        v0_00[4] = (float)in_stack_fffffffffffffd40._8_4_;
        v0_00[5] = (float)in_stack_fffffffffffffd40._12_4_;
        v0_00[6] = (float)in_stack_fffffffffffffd40._16_4_;
        v0_00[7] = (float)in_stack_fffffffffffffd40._20_4_;
        v1[2] = (float)(int)in_stack_fffffffffffffd20;
        v1[3] = (float)(int)((ulong)in_stack_fffffffffffffd20 >> 0x20);
        v1._0_8_ = puVar10;
        v1._16_8_ = puVar11;
        v1._24_8_ = plVar12;
        float2bfloat_avx(v0_00,v1);
        local_58 = local_278;
        auVar1._8_8_ = uVar5;
        auVar1._0_8_ = uVar13;
        auVar1._16_8_ = uVar6;
        auVar1._24_8_ = uVar7;
        *local_278 = auVar1;
        local_228 = local_228 + 8;
        local_278 = local_278 + 1;
        local_80 = uVar13;
        uStack_78 = uVar5;
        uStack_70 = uVar6;
        uStack_68 = uVar7;
      }
      for (; iVar3 + 7 < local_218; iVar3 = iVar3 + 8) {
        local_128 = local_228;
        uVar13 = *local_228;
        uVar5 = local_228[1];
        v0._8_8_ = puVar8;
        v0[0] = (float)(int)in_stack_fffffffffffffcf8;
        v0[1] = (float)(int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
        v0._16_8_ = plVar9;
        v0._24_8_ = puVar4;
        float2bfloat_avx(v0);
        local_40 = local_278;
        auVar2._8_8_ = uVar5;
        auVar2._0_8_ = uVar13;
        *(undefined1 (*) [16])*local_278 = auVar2;
        local_228 = local_228 + 4;
        local_278 = (undefined1 (*) [32])(*local_278 + 0x10);
        local_50 = uVar13;
        uStack_48 = uVar5;
      }
      for (; iVar3 < local_218; iVar3 = iVar3 + 1) {
        local_38 = *(undefined4 *)local_228;
        *(short *)*local_278 = (short)((uint)local_38 >> 0x10);
        local_278 = (undefined1 (*) [32])(*local_278 + 2);
        local_228 = (undefined8 *)((long)local_228 + 4);
        local_34 = local_38;
      }
    }
  }
  else {
    cast_fp32_to_bf16_sse_avx512bf16
              (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,(Option *)0x1db220e);
  }
  return;
}

Assistant:

static void cast_fp32_to_bf16_sse(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
#if NCNN_RUNTIME_CPU && NCNN_AVX512BF16 && __AVX512F__ && !__AVX512BF16__
    if (ncnn::cpu_support_x86_avx512_bf16())
    {
        cast_fp32_to_bf16_sse_avx512bf16(bottom_blob, top_blob, opt);
        return;
    }
#endif

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int d = bottom_blob.d;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    const int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);
        unsigned short* outptr = top_blob.channel(q);

        int i = 0;
#if __AVX512BF16__
        for (; i + 15 < size; i += 16)
        {
            __m512 _v_fp32 = _mm512_loadu_ps(ptr);
            __m256bh _v_bf16 = _mm512_cvtneps_pbh(_v_fp32);
            _mm256_storeu_si256((__m256i*)outptr, (__m256i)_v_bf16);

            ptr += 16;
            outptr += 16;
        }
        for (; i + 7 < size; i += 8)
        {
            __m256 _v_fp32 = _mm256_loadu_ps(ptr);
            __m128bh _v_bf16 = _mm256_cvtneps_pbh(_v_fp32);
            _mm_storeu_si128((__m128i*)outptr, (__m128i)_v_bf16);

            ptr += 8;
            outptr += 8;
        }
#elif __AVX2__
        for (; i + 15 < size; i += 16)
        {
            _mm256_storeu_si256((__m256i*)outptr, float2bfloat_avx(_mm256_loadu_ps(ptr), _mm256_loadu_ps(ptr + 8)));
            ptr += 16;
            outptr += 16;
        }
        for (; i + 7 < size; i += 8)
        {
            _mm_store_si128((__m128i*)outptr, float2bfloat_avx(_mm256_loadu_ps(ptr)));
            ptr += 8;
            outptr += 8;
        }
#endif
        for (; i < size; i++)
        {
            *outptr++ = float32_to_bfloat16(*ptr++);
        }
    }
}